

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall
diy::RegularLink<diy::Bounds<double>_>::load
          (RegularLink<diy::Bounds<double>_> *this,BinaryBuffer *bb)

{
  Link *in_RSI;
  Bounds<double> *in_RDI;
  
  Link::load(in_RSI,(BinaryBuffer *)in_RDI);
  load<int>((BinaryBuffer *)in_RSI,(int *)in_RDI);
  load<std::map<diy::Direction,int,std::less<diy::Direction>,std::allocator<std::pair<diy::Direction_const,int>>>>
            ((BinaryBuffer *)in_RSI,
             (map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
              *)in_RDI);
  load<std::vector<diy::Direction,std::allocator<diy::Direction>>>
            ((BinaryBuffer *)in_RSI,
             (vector<diy::Direction,_std::allocator<diy::Direction>_> *)in_RDI);
  load<diy::Bounds<double>>((BinaryBuffer *)in_RSI,in_RDI);
  load<diy::Bounds<double>>((BinaryBuffer *)in_RSI,in_RDI);
  load<std::vector<diy::Bounds<double>,std::allocator<diy::Bounds<double>>>>
            ((BinaryBuffer *)in_RSI,
             (vector<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_> *)in_RDI);
  load<std::vector<diy::Bounds<double>,std::allocator<diy::Bounds<double>>>>
            ((BinaryBuffer *)in_RSI,
             (vector<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_> *)in_RDI);
  load<std::vector<diy::Direction,std::allocator<diy::Direction>>>
            ((BinaryBuffer *)in_RSI,
             (vector<diy::Direction,_std::allocator<diy::Direction>_> *)in_RDI);
  return;
}

Assistant:

void      load(BinaryBuffer& bb) override
      {
          Link::load(bb);
          diy::load(bb, dim_);
          diy::load(bb, dir_map_);
          diy::load(bb, dir_vec_);
          diy::load(bb, core_);
          diy::load(bb, bounds_);
          diy::load(bb, nbr_cores_);
          diy::load(bb, nbr_bounds_);
          diy::load(bb, wrap_);
      }